

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O0

int lheader(lua_State *L)

{
  char *pcVar1;
  ulong local_38;
  size_t sz;
  int i;
  uint8_t *s;
  size_t len;
  lua_State *L_local;
  
  len = (size_t)L;
  pcVar1 = luaL_checklstring(L,1,(size_t *)&s);
  if ((s < (uint8_t *)0x5) && (s != (uint8_t *)0x0)) {
    local_38 = 0;
    for (sz._4_4_ = 0; sz._4_4_ < (int)s; sz._4_4_ = sz._4_4_ + 1) {
      local_38 = (ulong)(byte)pcVar1[sz._4_4_] | local_38 << 8;
    }
    lua_pushinteger((lua_State *)len,local_38);
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = luaL_error((lua_State *)len,"Invalid read %s",pcVar1);
  }
  return L_local._4_4_;
}

Assistant:

static int
lheader(lua_State *L) {
	size_t len;
	const uint8_t * s = (const uint8_t *)luaL_checklstring(L, 1, &len);
	if (len > 4 || len < 1) {
		return luaL_error(L, "Invalid read %s", s);
	}
	int i;
	size_t sz = 0;
	for (i=0;i<(int)len;i++) {
		sz <<= 8;
		sz |= s[i];
	}

	lua_pushinteger(L, (lua_Integer)sz);

	return 1;
}